

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O3

void duckdb::BitStringAggOperation::
     Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
               (BitAggState<signed_char> *state,char *input,AggregateUnaryInput *unary_input)

{
  char cVar1;
  AggregateInputData *this;
  FunctionData *pFVar2;
  int8_t iVar3;
  int8_t max;
  idx_t len;
  idx_t iVar4;
  void *__src;
  BinderException *this_00;
  OutOfRangeException *pOVar5;
  InvalidInputException *this_01;
  anon_union_16_2_67f50693_for_value local_130;
  char local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = unary_input->input;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
  pFVar2 = (this->bind_data).ptr;
  if (state->is_set == false) {
    if ((*(char *)&pFVar2[4]._vptr_FunctionData != '\0') ||
       (*(char *)&pFVar2[0xc]._vptr_FunctionData == '\x01')) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_130._0_8_ = local_120;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "Could not retrieve required statistics. Alternatively, try by providing the statistics explicitly: BITSTRING_AGG(col, min, max) "
                 ,"");
      BinderException::BinderException(this_00,(string *)&local_130.pointer);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar3 = Value::GetValue<signed_char>((Value *)(pFVar2 + 1));
    state->min = iVar3;
    iVar3 = Value::GetValue<signed_char>((Value *)(pFVar2 + 9));
    state->max = iVar3;
    if (iVar3 < state->min) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_130._0_8_ = local_120;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "Invalid explicit bitstring range: Minimum (%s) > maximum (%s)","");
      NumericHelper::ToString<signed_char>(&local_50,state->min);
      NumericHelper::ToString<signed_char>(&local_70,state->max);
      InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                (this_01,(string *)&local_130.pointer,&local_50,&local_70);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar3 = Value::GetValue<signed_char>((Value *)(pFVar2 + 1));
    max = Value::GetValue<signed_char>((Value *)(pFVar2 + 9));
    len = GetRange<signed_char>(iVar3,max);
    if (1000000000 < len) {
      pOVar5 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_130._0_8_ = local_120;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "The range between min and max value (%s <-> %s) is too large for bitstring aggregation"
                 ,"");
      NumericHelper::ToString<signed_char>(&local_90,state->min);
      NumericHelper::ToString<signed_char>(&local_b0,state->max);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                (pOVar5,(string *)&local_130.pointer,&local_90,&local_b0);
      __cxa_throw(pOVar5,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar4 = Bit::ComputeBitstringLen(len);
    local_130.pointer.length = (uint32_t)iVar4;
    if (0xc < iVar4) {
      __src = operator_new__(iVar4);
      if (local_130.pointer.length < 0xd) {
        local_130._12_4_ = 0;
        local_130.pointer.prefix[0] = '\0';
        local_130.pointer.prefix[1] = '\0';
        local_130.pointer.prefix[2] = '\0';
        local_130.pointer.prefix[3] = '\0';
        local_130._8_4_ = 0;
        if (local_130.pointer.length != 0) {
          switchD_012b9b0d::default
                    (local_130.pointer.prefix,__src,(ulong)(local_130.pointer.length & 0xf));
        }
      }
      else {
        local_130._8_4_ = SUB84(__src,0);
        local_130._12_4_ = (undefined4)((ulong)__src >> 0x20);
      }
    }
    Bit::SetEmptyBitString((bitstring_t *)&local_130.pointer,len);
    (state->value).value.pointer.length = local_130.pointer.length;
    *(char (*) [4])((long)&(state->value).value + 4) = local_130.pointer.prefix;
    *(undefined4 *)((long)&(state->value).value + 8) = local_130._8_4_;
    *(undefined4 *)((long)&(state->value).value + 0xc) = local_130._12_4_;
    state->is_set = true;
  }
  cVar1 = *input;
  if ((state->min <= cVar1) && (cVar1 <= state->max)) {
    iVar3 = Value::GetValue<signed_char>((Value *)(pFVar2 + 1));
    Bit::SetBit(&state->value,(long)cVar1 - (long)iVar3,1);
    return;
  }
  pOVar5 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_130._0_8_ = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"Value %s is outside of provided min and max range (%s <-> %s)",""
            );
  NumericHelper::ToString<signed_char>(&local_d0,*input);
  NumericHelper::ToString<signed_char>(&local_f0,state->min);
  NumericHelper::ToString<signed_char>(&local_110,state->max);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pOVar5,(string *)&local_130.pointer,&local_d0,&local_f0,&local_110);
  __cxa_throw(pOVar5,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_agg_data = unary_input.input.bind_data->template Cast<BitstringAggBindData>();
		if (!state.is_set) {
			if (bind_agg_data.min.IsNull() || bind_agg_data.max.IsNull()) {
				throw BinderException(
				    "Could not retrieve required statistics. Alternatively, try by providing the statistics "
				    "explicitly: BITSTRING_AGG(col, min, max) ");
			}
			state.min = bind_agg_data.min.GetValue<INPUT_TYPE>();
			state.max = bind_agg_data.max.GetValue<INPUT_TYPE>();
			if (state.min > state.max) {
				throw InvalidInputException("Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",
				                            NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t bit_range =
			    GetRange(bind_agg_data.min.GetValue<INPUT_TYPE>(), bind_agg_data.max.GetValue<INPUT_TYPE>());
			if (bit_range > MAX_BIT_RANGE) {
				throw OutOfRangeException(
				    "The range between min and max value (%s <-> %s) is too large for bitstring aggregation",
				    NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t len = Bit::ComputeBitstringLen(bit_range);
			auto target = len > string_t::INLINE_LENGTH ? string_t(new char[len], UnsafeNumericCast<uint32_t>(len))
			                                            : string_t(UnsafeNumericCast<uint32_t>(len));
			Bit::SetEmptyBitString(target, bit_range);

			state.value = target;
			state.is_set = true;
		}
		if (input >= state.min && input <= state.max) {
			Execute(state, input, bind_agg_data.min.GetValue<INPUT_TYPE>());
		} else {
			throw OutOfRangeException("Value %s is outside of provided min and max range (%s <-> %s)",
			                          NumericHelper::ToString(input), NumericHelper::ToString(state.min),
			                          NumericHelper::ToString(state.max));
		}
	}